

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

int amqp_merge_capabilities
              (amqp_table_t *base,amqp_table_t *add,amqp_table_t *result,amqp_pool_t *pool)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  size_t *psVar4;
  amqp_table_entry_t_ *paVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int64_t iVar8;
  size_t sVar9;
  void *pvVar10;
  int iVar11;
  long lVar12;
  amqp_table_entry_t *paVar13;
  amqp_table_entry_t *paVar14;
  long lVar15;
  int unaff_EBP;
  long lVar16;
  bool bVar17;
  amqp_bytes_t key;
  amqp_bytes_t key_00;
  amqp_pool_t temp_pool;
  amqp_table_t local_90;
  amqp_table_t *local_80;
  amqp_pool_t *local_78;
  amqp_pool_t local_70;
  
  if (add == (amqp_table_t *)0x0) {
    iVar11 = amqp_table_clone(base,result,pool);
    return iVar11;
  }
  init_amqp_pool(&local_70,0x1000);
  local_90.num_entries = 0;
  local_90.entries =
       (amqp_table_entry_t_ *)
       amqp_pool_alloc(&local_70,((long)add->num_entries + (long)base->num_entries) * 0x28);
  if (local_90.entries == (amqp_table_entry_t_ *)0x0) {
    unaff_EBP = -1;
  }
  else {
    if (0 < base->num_entries) {
      lVar16 = 0;
      lVar12 = 0;
      do {
        paVar5 = base->entries;
        *(undefined8 *)((long)&local_90.entries[local_90.num_entries].value.value + lVar16 + 8) =
             *(undefined8 *)((long)&(paVar5->value).value + lVar16 + 8);
        puVar3 = (undefined8 *)((long)&(paVar5->key).len + lVar16);
        uVar6 = *puVar3;
        uVar7 = puVar3[1];
        puVar1 = &(paVar5->value).kind + lVar16;
        iVar8 = ((anon_union_16_15_ecedea02_for_value *)(puVar1 + 8))->i64;
        puVar2 = &local_90.entries[local_90.num_entries].value.kind + lVar16;
        *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
        ((anon_union_16_15_ecedea02_for_value *)(puVar2 + 8))->i64 = iVar8;
        puVar3 = (undefined8 *)((long)&local_90.entries[local_90.num_entries].key.len + lVar16);
        *puVar3 = uVar6;
        puVar3[1] = uVar7;
        lVar12 = lVar12 + 1;
        lVar16 = lVar16 + 0x28;
      } while (lVar12 < base->num_entries);
      local_90.num_entries = (int)lVar12 + local_90.num_entries;
    }
    local_80 = result;
    local_78 = pool;
    if (0 < add->num_entries) {
      lVar16 = 0x18;
      lVar12 = 0;
      do {
        key.bytes = *(void **)((long)add->entries + lVar16 + -0x10);
        key.len = *(size_t *)((long)add->entries + lVar16 + -0x18);
        paVar13 = amqp_table_get_entry_by_key(&local_90,key);
        if (paVar13 == (amqp_table_entry_t *)0x0) {
          lVar15 = (long)local_90.num_entries;
          paVar5 = add->entries;
          local_90.entries[lVar15].value.value.bytes.bytes =
               *(void **)((long)&(paVar5->key).bytes + lVar16);
          psVar4 = (size_t *)((long)paVar5 + lVar16 + -0x18);
          sVar9 = *psVar4;
          pvVar10 = (void *)psVar4[1];
          puVar3 = (undefined8 *)((long)paVar5 + lVar16 + -8);
          iVar8 = puVar3[1];
          *(undefined8 *)&local_90.entries[lVar15].value = *puVar3;
          local_90.entries[lVar15].value.value.i64 = iVar8;
          local_90.entries[lVar15].key.len = sVar9;
          local_90.entries[lVar15].key.bytes = pvVar10;
          local_90.num_entries = local_90.num_entries + 1;
LAB_0010a5d6:
          bVar17 = true;
        }
        else {
          paVar5 = add->entries;
          if ((*(char *)((long)paVar5 + lVar16 + -8) != 'F') || ((paVar13->value).kind != 'F')) {
            (paVar13->value).value.bytes.bytes = *(void **)((long)&(paVar5->key).bytes + lVar16);
            puVar3 = (undefined8 *)((long)paVar5 + lVar16 + -8);
            iVar8 = puVar3[1];
            *(undefined8 *)&paVar13->value = *puVar3;
            (paVar13->value).value.i64 = iVar8;
            goto LAB_0010a5d6;
          }
          key_00.bytes = *(void **)((long)paVar5 + lVar16 + -0x10);
          key_00.len = *(size_t *)((long)paVar5 + lVar16 + -0x18);
          paVar14 = amqp_table_get_entry_by_key(base,key_00);
          unaff_EBP = amqp_merge_capabilities
                                (&(paVar14->value).value.table,
                                 (amqp_table_t *)((long)&(add->entries->key).len + lVar16),
                                 &(paVar13->value).value.table,&local_70);
          bVar17 = unaff_EBP == 0;
        }
        if (!bVar17) goto LAB_0010a629;
        lVar12 = lVar12 + 1;
        lVar16 = lVar16 + 0x28;
      } while (lVar12 < add->num_entries);
    }
    unaff_EBP = amqp_table_clone(&local_90,local_80,local_78);
  }
LAB_0010a629:
  empty_amqp_pool(&local_70);
  return unaff_EBP;
}

Assistant:

int amqp_merge_capabilities(const amqp_table_t *base, const amqp_table_t *add,
                            amqp_table_t *result, amqp_pool_t *pool) {
  int i;
  int res;
  amqp_pool_t temp_pool;
  amqp_table_t temp_result;
  assert(base != NULL);
  assert(result != NULL);
  assert(pool != NULL);

  if (NULL == add) {
    return amqp_table_clone(base, result, pool);
  }

  init_amqp_pool(&temp_pool, 4096);
  temp_result.num_entries = 0;
  temp_result.entries =
      amqp_pool_alloc(&temp_pool, sizeof(amqp_table_entry_t) *
                                      (base->num_entries + add->num_entries));
  if (NULL == temp_result.entries) {
    res = AMQP_STATUS_NO_MEMORY;
    goto error_out;
  }
  for (i = 0; i < base->num_entries; ++i) {
    temp_result.entries[temp_result.num_entries] = base->entries[i];
    temp_result.num_entries++;
  }
  for (i = 0; i < add->num_entries; ++i) {
    amqp_table_entry_t *e =
        amqp_table_get_entry_by_key(&temp_result, add->entries[i].key);
    if (NULL != e) {
      if (AMQP_FIELD_KIND_TABLE == add->entries[i].value.kind &&
          AMQP_FIELD_KIND_TABLE == e->value.kind) {
        amqp_table_entry_t *be =
            amqp_table_get_entry_by_key(base, add->entries[i].key);

        res = amqp_merge_capabilities(&be->value.value.table,
                                      &add->entries[i].value.value.table,
                                      &e->value.value.table, &temp_pool);
        if (AMQP_STATUS_OK != res) {
          goto error_out;
        }
      } else {
        e->value = add->entries[i].value;
      }
    } else {
      temp_result.entries[temp_result.num_entries] = add->entries[i];
      temp_result.num_entries++;
    }
  }
  res = amqp_table_clone(&temp_result, result, pool);
error_out:
  empty_amqp_pool(&temp_pool);
  return res;
}